

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir_Resampler.cpp
# Opt level: O3

double __thiscall
Fir_Resampler_::time_ratio(Fir_Resampler_ *this,double new_factor,double rolloff,double gain)

{
  int iVar1;
  short *__s;
  double dVar2;
  sample_t_conflict1 sVar3;
  ulong uVar4;
  ulong uVar5;
  int r;
  uint uVar6;
  sample_t_conflict1 *psVar7;
  long lVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double __x;
  double dVar19;
  double step;
  double pow_a_n;
  double local_100;
  double local_b8;
  
  this->res = -1;
  uVar6 = 1;
  dVar18 = 1.0;
  local_b8 = 2.0;
  local_100 = 0.0;
  uVar4 = 0xffffffff;
  dVar11 = 0.0;
  do {
    dVar11 = dVar11 + new_factor;
    dVar10 = floor(dVar11 + 0.5);
    if (ABS(dVar11 - dVar10) < local_b8) {
      this->res = uVar6;
      local_100 = dVar10 / dVar18;
      uVar4 = (ulong)uVar6;
      local_b8 = ABS(dVar11 - dVar10);
    }
    dVar18 = dVar18 + 1.0;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x21);
  iVar9 = 0;
  this->skip_bits = 0;
  dVar11 = floor(local_100);
  this->step = (int)dVar11 * 2;
  this->ratio_ = local_100;
  dVar18 = fmod(local_100,1.0);
  this->input_per_cycle = 0;
  if (0 < (int)uVar4) {
    dVar2 = (double)(-(ulong)(local_100 < 1.0) & 0x3ff0000000000000 |
                    ~-(ulong)(local_100 < 1.0) & (ulong)(1.0 / local_100));
    iVar1 = this->width_;
    dVar12 = (double)__powidf2(rolloff,0x100);
    dVar10 = gain * dVar2 * 63.998046875;
    psVar7 = this->impulses;
    dVar13 = 0.0;
    uVar5 = 0;
    uVar6 = 0;
    do {
      if (iVar1 != 0) {
        __x = (dVar13 + (double)(iVar1 / 2 + -1)) * dVar2 * -0.01227184630308513;
        lVar8 = 0;
        do {
          dVar19 = __x * 512.0 *
                   (1.0 / (double)(int)((int)((double)iVar1 * dVar2 + 1.0) & 0xfffffffe));
          if (3.141592653589793 <= ABS(dVar19)) {
            sVar3 = 0;
          }
          else {
            dVar14 = cos(__x);
            dVar15 = 1.0 - dVar14 * rolloff;
            dVar16 = cos(__x * 256.0);
            dVar17 = cos(__x * 255.0);
            dVar14 = (((dVar17 * dVar12 * rolloff - dVar16 * dVar12) + dVar15) * dVar10) /
                     ((rolloff * rolloff - dVar14 * rolloff) + dVar15) - dVar10;
            dVar19 = cos(dVar19);
            sVar3 = (sample_t_conflict1)(int)(dVar19 * dVar14 + dVar14);
          }
          psVar7[lVar8] = sVar3;
          __x = __x + dVar2 * 0.01227184630308513;
          lVar8 = lVar8 + 1;
        } while (iVar1 != (int)lVar8);
      }
      dVar13 = dVar13 + dVar18;
      iVar9 = iVar9 + (int)dVar11 * 2;
      if (0.9999999 <= dVar13) {
        dVar13 = dVar13 + -1.0;
        uVar6 = uVar6 | 1 << ((uint)uVar5 & 0x1f);
        this->skip_bits = uVar6;
        iVar9 = iVar9 + 1;
      }
      uVar5 = uVar5 + 1;
      psVar7 = psVar7 + iVar1;
    } while (uVar5 != uVar4);
    this->input_per_cycle = iVar9;
  }
  this->imp_phase = 0;
  if ((this->buf).size_ != 0) {
    __s = (this->buf).begin_;
    this->write_pos = __s + this->write_offset;
    memset(__s,0,(long)this->write_offset * 2);
    local_100 = this->ratio_;
  }
  return local_100;
}

Assistant:

double Fir_Resampler_::time_ratio( double new_factor, double rolloff, double gain )
{
	ratio_ = new_factor;
	
	double fstep = 0.0;
	{
		double least_error = 2;
		double pos = 0;
		res = -1;
		for ( int r = 1; r <= max_res; r++ )
		{
			pos += ratio_;
			double nearest = floor( pos + 0.5 );
			double error = fabs( pos - nearest );
			if ( error < least_error )
			{
				res = r;
				fstep = nearest / res;
				least_error = error;
			}
		}
	}
	
	skip_bits = 0;
	
	step = stereo * (int) floor( fstep );
	
	ratio_ = fstep;
	fstep = fmod( fstep, 1.0 );
	
	double filter = (ratio_ < 1.0) ? 1.0 : 1.0 / ratio_;
	double pos = 0.0;
	input_per_cycle = 0;
	for ( int i = 0; i < res; i++ )
	{
		gen_sinc( rolloff, int (width_ * filter + 1) & ~1, pos, filter,
				double (0x7FFF * gain * filter),
				(int) width_, impulses + i * width_ );
		
		pos += fstep;
		input_per_cycle += step;
		if ( pos >= 0.9999999 )
		{
			pos -= 1.0;
			skip_bits |= 1 << i;
			input_per_cycle++;
		}
	}
	
	clear();
	
	return ratio_;
}